

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_algebra.c
# Opt level: O2

void la_dgemv_noe(int m,int n,double alpha,double *a,int lda,double *x,int incx,double beta,
                 double *y,int incy,double *z,int incz)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  int j;
  ulong uVar4;
  double *pdVar5;
  double dVar6;
  
  if (a == (double *)0x0) {
    __assert_fail("a",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0xd5,
                  "void la_dgemv_noe(int, int, double, const double *, int, const double *, int, double, const double *, int, double *, int)"
                 );
  }
  if (x == (double *)0x0) {
    __assert_fail("x",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0xd6,
                  "void la_dgemv_noe(int, int, double, const double *, int, const double *, int, double, const double *, int, double *, int)"
                 );
  }
  if (y == (double *)0x0) {
    __assert_fail("y",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0xd7,
                  "void la_dgemv_noe(int, int, double, const double *, int, const double *, int, double, const double *, int, double *, int)"
                 );
  }
  if (z == (double *)0x0) {
    __assert_fail("z",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0xd8,
                  "void la_dgemv_noe(int, int, double, const double *, int, const double *, int, double, const double *, int, double *, int)"
                 );
  }
  if (x == z) {
    __assert_fail("x != z",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0xd9,
                  "void la_dgemv_noe(int, int, double, const double *, int, const double *, int, double, const double *, int, double *, int)"
                 );
  }
  if (x == y) {
    __assert_fail("x != y",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0xda,
                  "void la_dgemv_noe(int, int, double, const double *, int, const double *, int, double, const double *, int, double *, int)"
                 );
  }
  if ((lda < 1) || (lda < n)) {
    __assert_fail("lda >= 1 && lda >= n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0xdb,
                  "void la_dgemv_noe(int, int, double, const double *, int, const double *, int, double, const double *, int, double *, int)"
                 );
  }
  if (incx < 1) {
    __assert_fail("incx > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0xdc,
                  "void la_dgemv_noe(int, int, double, const double *, int, const double *, int, double, const double *, int, double *, int)"
                 );
  }
  if (incy < 1) {
    __assert_fail("incy > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0xdd,
                  "void la_dgemv_noe(int, int, double, const double *, int, const double *, int, double, const double *, int, double *, int)"
                 );
  }
  if (incz < 1) {
    __assert_fail("incz > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0xde,
                  "void la_dgemv_noe(int, int, double, const double *, int, const double *, int, double, const double *, int, double *, int)"
                 );
  }
  uVar3 = 0;
  uVar2 = (ulong)(uint)m;
  if (m < 1) {
    uVar2 = uVar3;
  }
  uVar1 = (ulong)(uint)n;
  if (n < 1) {
    uVar1 = uVar3;
  }
  for (; uVar3 != uVar1; uVar3 = uVar3 + 1) {
    dVar6 = y[uVar3 * (uint)incy] * beta;
    pdVar5 = x;
    for (uVar4 = 0; uVar2 != uVar4; uVar4 = uVar4 + 1) {
      dVar6 = dVar6 + a[uVar4] * alpha * *pdVar5;
      pdVar5 = pdVar5 + (uint)incx;
    }
    z[uVar3 * (uint)incz] = dVar6;
    a = a + (uint)lda;
  }
  return;
}

Assistant:

void la_dgemv_noe(
        int m, int n,
        double alpha,
        const double *a, int lda,
        const double *x, int incx,
        double beta,
        const double *y, int incy,
        double *z, int incz)
{
    assert(a);
    assert(x);
    assert(y);
    assert(z);
    assert(x != z);
    assert(x != y);
    assert(lda >= 1 && lda >= n);
    assert(incx > 0);
    assert(incy > 0);
    assert(incz > 0);

    for (int i = 0; i < n; i++) {
        double zi = beta * y[i * incy];
        for (int j = 0; j < m; j++) {
            zi += alpha * a[i * lda + j] * x[j * incx];
        }
        z[i * incz] = zi;
    }
}